

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_add_bulk(void **param_1)

{
  roaring64_bitmap_t *val;
  roaring64_bulk_context_t *in_RDI;
  roaring64_bitmap_t *unaff_retaddr;
  uint64_t i_1;
  uint64_t i;
  roaring64_bulk_context_t context;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000060;
  int in_stack_ffffffffffffffcc;
  roaring64_bitmap_t *in_stack_ffffffffffffffd0;
  char *file;
  char *expression;
  uint64_t in_stack_ffffffffffffffe0;
  roaring64_bitmap_t *in_stack_ffffffffffffffe8;
  
  val = roaring64_bitmap_create();
  memset(&stack0xffffffffffffffe0,0,0x10);
  for (expression = (char *)0x0; expression < (char *)0x2710; expression = expression + 1) {
    roaring64_bitmap_add_bulk(unaff_retaddr,in_RDI,(uint64_t)val);
    assert_r64_valid(in_stack_ffffffffffffffd0);
  }
  for (file = (char *)0x0; file < (char *)0x2710; file = file + 1) {
    roaring64_bitmap_contains(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    _assert_true(in_stack_ffffffffffffffe0,expression,file,in_stack_ffffffffffffffcc);
  }
  roaring64_bitmap_free(in_stack_00000060);
  return;
}

Assistant:

DEFINE_TEST(test_add_bulk) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 10000; ++i) {
        roaring64_bitmap_add_bulk(r, &context, i * 10000);
        assert_r64_valid(r);
    }
    for (uint64_t i = 0; i < 10000; ++i) {
        assert_true(roaring64_bitmap_contains(r, i * 10000));
    }

    roaring64_bitmap_free(r);
}